

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_act.c
# Opt level: O1

bool redit_create(CHAR_DATA *ch,char *argument)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  bool bVar4;
  uint uVar5;
  char *pcVar6;
  ROOM_INDEX_DATA *pRVar7;
  char *txt;
  AREA_DATA_conflict *pAVar8;
  char buf [4608];
  char acStack_1238 [4616];
  
  txt = acStack_1238;
  uVar5 = atoi(argument);
  pAVar8 = area_first;
  if ((int)uVar5 < 1 || *argument == '\0') {
    pcVar3 = "Syntax:  create [vnum > 0]\n\r";
  }
  else {
    for (; pAVar8 != (AREA_DATA_conflict *)0x0; pAVar8 = pAVar8->next) {
      if (((int)pAVar8->min_vnum <= (int)uVar5) && ((int)uVar5 <= (int)pAVar8->max_vnum))
      goto LAB_00363ada;
    }
    pAVar8 = (AREA_DATA_conflict *)0x0;
LAB_00363ada:
    if (pAVar8 == (AREA_DATA_conflict *)0x0) {
      pcVar3 = "REdit:  That vnum is not assigned an area.\n\r";
    }
    else {
      bVar4 = is_switched(ch);
      pcVar3 = "REdit:  Vnum in an area you cannot build in.\n\r";
      if (!bVar4) {
        iVar1 = ch->pcdata->security;
        iVar2 = pAVar8->security;
        if ((((iVar2 < iVar1) || (pcVar6 = strstr(pAVar8->builders,ch->name), iVar2 < iVar1)) ||
            (pcVar6 != (char *)0x0)) ||
           (pcVar6 = strstr(pAVar8->builders,"All"), pcVar6 != (char *)0x0)) {
          pRVar7 = get_room_index(0);
          if (pRVar7 == (ROOM_INDEX_DATA *)0x0) {
            pRVar7 = new_room_index();
            pRVar7->area = pAVar8;
            pRVar7->vnum = (short)uVar5;
            if (top_vnum_room < (int)uVar5) {
              top_vnum_room = uVar5;
            }
            pRVar7->next = room_index_hash[uVar5 & 0x3ff];
            room_index_hash[uVar5 & 0x3ff] = pRVar7;
            ch->desc->pEdit = pRVar7;
            sprintf(acStack_1238,"Room #%d created.\n\r",(ulong)uVar5);
            bVar4 = true;
            goto LAB_00363b5f;
          }
          pcVar3 = "REdit:  Room vnum already exists.\n\r";
        }
      }
    }
  }
  txt = pcVar3;
  bVar4 = false;
LAB_00363b5f:
  send_to_char(txt,ch);
  return bVar4;
}

Assistant:

bool redit_create(CHAR_DATA *ch, char *argument)
{
	AREA_DATA *pArea;
	ROOM_INDEX_DATA *pRoom;
	int value;
	int iHash;
	char buf[MSL];

	EDIT_ROOM(ch, pRoom);

	value = atoi(argument);

	if (argument[0] == '\0' || value <= 0)
	{
		send_to_char("Syntax:  create [vnum > 0]\n\r", ch);
		return false;
	}

	pArea = get_vnum_area(value);

	if (!pArea)
	{
		send_to_char("REdit:  That vnum is not assigned an area.\n\r", ch);
		return false;
	}

	if (!IS_BUILDER(ch, pArea))
	{
		send_to_char("REdit:  Vnum in an area you cannot build in.\n\r", ch);
		return false;
	}

	if (get_room_index(value))
	{
		send_to_char("REdit:  Room vnum already exists.\n\r", ch);
		return false;
	}

	pRoom = new_room_index();
	pRoom->area = pArea;
	pRoom->vnum = value;

	if (value > top_vnum_room)
		top_vnum_room = value;

	iHash = value % MAX_KEY_HASH;
	pRoom->next = room_index_hash[iHash];
	room_index_hash[iHash] = pRoom;
	ch->desc->pEdit = (void *)pRoom;

	sprintf(buf, "Room #%d created.\n\r", value);
	send_to_char(buf, ch);
	return true;
}